

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall ON_BinaryArchive::WriteObjectUserData(ON_BinaryArchive *this,ON_Object *object)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  uint i;
  ulong uVar5;
  char *pcVar6;
  ON_UnknownUserData *pOVar7;
  ON_3DM_BIG_CHUNK *pOVar8;
  uint local_f8;
  uint local_f4;
  bool local_e3;
  bool local_e2;
  bool local_e1;
  uint app_ver_to_write;
  uint app_ver;
  int file_format_ver;
  ON_UnknownUserData *unknown_ud;
  ON_UUID local_a0;
  ON_UUID local_90;
  ON_UUID local_80;
  ON_UUID local_70;
  ON_UUID local_60;
  ON_ClassId *local_50;
  ON_ClassId *cid;
  ON_UserData *delete_this_ud;
  ON_UUID userdata_classid;
  ON_UserData *ud;
  bool rc;
  bool bHasWritableUserData;
  bool bSaveSelectedUserData;
  bool bSaveAllUserData;
  ON_Object *object_local;
  ON_BinaryArchive *this_local;
  
  if (this->m_3dm_version < 3) {
    this_local._7_1_ = true;
  }
  else {
    bVar1 = ShouldSerializeAllUserData(this);
    if (bVar1) {
      local_e1 = false;
    }
    else {
      local_e1 = ShouldSerializeSomeUserData(this);
    }
    local_e2 = true;
    if (!bVar1) {
      local_e2 = ObjectHasUserDataToWrite(this,object);
    }
    ud._4_1_ = true;
    cid = (ON_ClassId *)0x0;
    userdata_classid.Data4 = (uchar  [8])ON_Object::FirstUserData(object);
    while( true ) {
      local_e3 = false;
      if (userdata_classid.Data4 != (uchar  [8])0x0) {
        local_e3 = ud._4_1_;
      }
      if (local_e3 == false) break;
      if (cid != (ON_ClassId *)0x0) {
        if (((*&(cid->m_uuid).Data4 == userdata_classid.Data4) &&
            (bVar2 = ON_Object::DetachUserData(object,(ON_UserData *)cid), bVar2)) &&
           (cid != (ON_ClassId *)0x0)) {
          (**(code **)(cid->m_pNext->m_sClassName + 0x10))();
        }
        cid = (ON_ClassId *)0x0;
      }
      uVar5 = (**(code **)(*(long *)userdata_classid.Data4 + 0xd8))
                        (userdata_classid.Data4,this,object);
      if ((uVar5 & 1) != 0) {
        cid = (ON_ClassId *)userdata_classid.Data4;
      }
      if (((local_e2 != false) &&
          (uVar5 = (**(code **)(*(long *)userdata_classid.Data4 + 0xd0))
                             (userdata_classid.Data4,this,object), (uVar5 & 1) != 0)) &&
         (((iVar4 = ON_UuidCompare((ON_UUID *)((long)userdata_classid.Data4 + 0x10),&ON_nil_uuid),
           iVar4 != 0 &&
           (((object == *(ON_Object **)((long)userdata_classid.Data4 + 0xb8) &&
             (local_50 = (ON_ClassId *)(*(code *)**(undefined8 **)userdata_classid.Data4)(),
             local_50 != (ON_ClassId *)0x0)) && (local_50 != &ON_UserData::m_ON_UserData_class_rtti)
            ))) && (local_50 != &ON_Object::m_ON_Object_class_rtti)))) {
        local_60 = ON_UserData::UserDataClassUuid((ON_UserData *)userdata_classid.Data4);
        delete_this_ud = (ON_UserData *)local_60._0_8_;
        userdata_classid._0_8_ = local_60.Data4;
        iVar4 = ON_UuidCompare((ON_UUID *)&delete_this_ud,&ON_nil_uuid);
        if (iVar4 != 0) {
          local_70 = ON_ClassId::Uuid(&ON_UserData::m_ON_UserData_class_rtti);
          iVar4 = ON_UuidCompare((ON_UUID *)&delete_this_ud,&local_70);
          if (iVar4 != 0) {
            local_80 = ON_ClassId::Uuid(&ON_Object::m_ON_Object_class_rtti);
            iVar4 = ON_UuidCompare((ON_UUID *)&delete_this_ud,&local_80);
            if (iVar4 != 0) {
              local_90 = ON_ClassId::Uuid(&ON_UnknownUserData::m_ON_UnknownUserData_class_rtti);
              iVar4 = ON_UuidCompare((ON_UUID *)&delete_this_ud,&local_90);
              if (iVar4 != 0) {
                local_a0 = ON_ClassId::Uuid(&ON_ObsoleteUserData::m_ON_ObsoleteUserData_class_rtti);
                iVar4 = ON_UuidCompare((ON_UUID *)&delete_this_ud,&local_a0);
                if (((iVar4 != 0) &&
                    ((this->m_3dm_version != 3 ||
                     (iVar4 = ON_SimpleArray<ON_UUID_struct>::BinarySearch
                                        (&this->m_V3_plugin_id_list,
                                         (ON_UUID_struct *)((long)userdata_classid.Data4 + 0x20),
                                         ON_UuidCompare), -1 < iVar4)))) &&
                   ((bVar1 || (bVar2 = ShouldSerializeUserDataItem
                                                 (this,*(ON_UUID *)
                                                        ((long)userdata_classid.Data4 + 0x20),
                                                  *(ON_UUID *)((long)userdata_classid.Data4 + 0x10))
                              , bVar2)))) {
                  bVar2 = ON_UuidIsNil((ON_UUID *)((long)userdata_classid.Data4 + 0x20));
                  if (bVar2) {
                    pcVar6 = ON_ClassId::ClassName(local_50);
                    ON_Error("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                             ,0x130f,"Not saving %s userdata - m_application_uuid is nil.",pcVar6);
                  }
                  else {
                    pOVar7 = ON_UnknownUserData::Cast((ON_Object *)userdata_classid.Data4);
                    if (pOVar7 == (ON_UnknownUserData *)0x0) {
                      bVar2 = ON_UserData::IsUnknownUserData((ON_UserData *)userdata_classid.Data4);
                      if (bVar2) {
                        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                                   ,0x131a,"",
                                   "ON_UnknownUserData::Cast(ud) is null and ud->IsUnknownUserData() is true."
                                  );
                      }
                      else {
LAB_0049b092:
                        if (((pOVar7 == (ON_UnknownUserData *)0x0) ||
                            ((((bVar1 || (local_e1 != false)) &&
                              ((3 < pOVar7->m_3dm_version &&
                               (((pOVar7->m_3dm_version < 6 || (0x31 < pOVar7->m_3dm_version)) &&
                                (0xbf67451 < pOVar7->m_3dm_opennurbs_version_number)))))) &&
                             ((pOVar7->m_3dm_version < 0x32 || (0x31 < this->m_3dm_version)))))) &&
                           (ud._4_1_ = BeginWrite3dmChunk(this,0x27ffd,0), ud._4_1_)) {
                          Write3dmChunkVersion(this,2,2);
                          ud._4_1_ = BeginWrite3dmChunk(this,0x2fff9,0);
                          if (ud._4_1_) {
                            if (ud._4_1_) {
                              ud._4_1_ = WriteUuid(this,(ON_UUID *)&delete_this_ud);
                            }
                            if (ud._4_1_ != false) {
                              ud._4_1_ = WriteUuid(this,(ON_UUID *)
                                                        ((long)userdata_classid.Data4 + 0x10));
                            }
                            if (ud._4_1_ != false) {
                              ud._4_1_ = WriteInt(this,*(ON__UINT32 *)
                                                        ((long)userdata_classid.Data4 + 0x30));
                            }
                            if (ud._4_1_ != false) {
                              ud._4_1_ = WriteXform(this,(ON_Xform *)
                                                         ((long)userdata_classid.Data4 + 0x38));
                            }
                            if (ud._4_1_ != false) {
                              ud._4_1_ = WriteUuid(this,(ON_UUID *)
                                                        ((long)userdata_classid.Data4 + 0x20));
                            }
                            if (ud._4_1_ != false) {
                              WriteBool(this,(bool)(-(pOVar7 != (ON_UnknownUserData *)0x0) & 1));
                              if (pOVar7 == (ON_UnknownUserData *)0x0) {
                                local_f4 = this->m_3dm_version;
                              }
                              else {
                                local_f4 = pOVar7->m_3dm_version;
                              }
                              ud._4_1_ = WriteInt(this,local_f4);
                              if (pOVar7 == (ON_UnknownUserData *)0x0) {
                                local_f8 = this->m_3dm_opennurbs_version;
                              }
                              else {
                                local_f8 = pOVar7->m_3dm_opennurbs_version_number;
                              }
                              i = ArchiveOpenNURBSVersionToWrite(local_f4,local_f8);
                              if (ud._4_1_) {
                                ud._4_1_ = WriteInt(this,i);
                              }
                            }
                            bVar2 = EndWrite3dmChunk(this);
                            if (!bVar2) {
                              ud._4_1_ = false;
                            }
                          }
                          if ((ud._4_1_ != false) &&
                             (ud._4_1_ = BeginWrite3dmChunk(this,0x40008000,0), ud._4_1_)) {
                            if (pOVar7 != (ON_UnknownUserData *)0x0) {
                              pOVar8 = ON_SimpleArray<ON_3DM_BIG_CHUNK>::Last(&this->m_chunk);
                              pOVar8->m_do_crc16 = '\0';
                              pOVar8 = ON_SimpleArray<ON_3DM_BIG_CHUNK>::Last(&this->m_chunk);
                              pOVar8->m_do_crc32 = '\0';
                              this->m_bDoChunkCRC = false;
                            }
                            if (this->m_user_data_depth < 0) {
                              ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                                         ,0x137d,"","m_user_data_depth < 0");
                              this->m_user_data_depth = 0;
                            }
                            this->m_user_data_depth = this->m_user_data_depth + 1;
                            cVar3 = (**(code **)(*(long *)userdata_classid.Data4 + 0x50))();
                            ud._4_1_ = (bool)(-cVar3 & 1);
                            this->m_user_data_depth = this->m_user_data_depth + -1;
                            bVar2 = EndWrite3dmChunk(this);
                            if (!bVar2) {
                              ud._4_1_ = false;
                            }
                          }
                          bVar2 = EndWrite3dmChunk(this);
                          if (!bVar2) {
                            ud._4_1_ = false;
                          }
                        }
                      }
                    }
                    else {
                      bVar2 = ON_UserData::IsUnknownUserData((ON_UserData *)userdata_classid.Data4);
                      if (bVar2) goto LAB_0049b092;
                      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                                 ,0x1322,"",
                                 "ON_UnknownUserData::Cast(ud) is not null and ud->IsUnknownUserData() is false."
                                );
                    }
                  }
                }
              }
            }
          }
        }
      }
      userdata_classid.Data4 = *(uchar (*) [8])((long)userdata_classid.Data4 + 0xc0);
    }
    if ((((cid != (ON_ClassId *)0x0) && (*(long *)(cid->m_uuid).Data4 == 0)) &&
        (bVar1 = ON_Object::DetachUserData(object,(ON_UserData *)cid), bVar1)) &&
       (cid != (ON_ClassId *)0x0)) {
      (**(code **)(cid->m_pNext->m_sClassName + 0x10))();
    }
    this_local._7_1_ = ud._4_1_;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_BinaryArchive::WriteObjectUserData( const ON_Object& object )
{
  if ( m_3dm_version < 3 )
  {
    // no user data is saved in V1 and V2 files.
    return true;
  }

  const bool bSaveAllUserData = ShouldSerializeAllUserData();
  const bool bSaveSelectedUserData = bSaveAllUserData ? false : ShouldSerializeSomeUserData();
  const bool bHasWritableUserData = (bSaveAllUserData || ObjectHasUserDataToWrite(&object));

  // writes user data attached to object.
  bool rc = true;
  const ON_UserData* ud;
  ON_UUID userdata_classid;

  ON_UserData* delete_this_ud = 0;
  
  for (ud = object.FirstUserData(); ud && rc; ud = ud->m_userdata_next) 
  {
    if (0 != delete_this_ud)
    {
      if (delete_this_ud->m_userdata_next == ud)
      {
        if (const_cast<ON_Object&>(object).DetachUserData(delete_this_ud))
          delete delete_this_ud;
      }
      delete_this_ud = 0;
    }

    if (ud->DeleteAfterWrite(*this,&object))
      delete_this_ud = const_cast< ON_UserData* >(ud);

    if (false == bHasWritableUserData)
      continue;

    if (!ud->WriteToArchive(*this,&object))
      continue;

    // LOTS of tests to weed out bogus user data
    if ( 0 == ON_UuidCompare( ud->m_userdata_uuid, ON_nil_uuid ) )
      continue;
    if ( &object != ud->m_userdata_owner )
      continue;
    const ON_ClassId* cid = ud->ClassId();
    if ( 0 == cid )
      continue;
    if ( cid == &ON_CLASS_RTTI(ON_UserData) )
      continue;
    if ( cid == &ON_CLASS_RTTI(ON_Object) )
      continue;

    // The UserDataClassUuid() function is used instead of 
    // calling cid->Uuid() so we get the value of the 
    // plug-in's class id when the plug-in is not loaded
    // and ud is ON_UnknownUserData.
    userdata_classid = ud->UserDataClassUuid();
    if ( 0 == ON_UuidCompare( userdata_classid, ON_nil_uuid ) )
      continue;
    if ( 0 == ON_UuidCompare( userdata_classid, ON_CLASS_ID(ON_UserData) ) )
      continue;
    if ( 0 == ON_UuidCompare( userdata_classid, ON_CLASS_ID(ON_Object) ) )
      continue;
    if (0 == ON_UuidCompare(userdata_classid, ON_CLASS_ID(ON_UnknownUserData)))
      continue;
    if (0 == ON_UuidCompare(userdata_classid, ON_CLASS_ID(ON_ObsoleteUserData)))
      continue;

    if ( 3 == m_3dm_version )
    {
      // When saving a V3 archive and the user data is not
      // native V3 data, make sure the plug-in supports
      // writing V3 user data.
      if ( m_V3_plugin_id_list.BinarySearch( &ud->m_application_uuid, ON_UuidCompare ) < 0 )
        continue;
    }

    if (false == bSaveAllUserData 
        && false == ShouldSerializeUserDataItem(ud->m_application_uuid, ud->m_userdata_uuid)
       )
      continue;

    if ( ON_UuidIsNil( ud->m_application_uuid ) )
    {
      // As of version 200909190 - a non-nil application_uuid is 
      // required in order for user data to be saved in a 
      // 3dm archive.
      ON_Error(__FILE__,__LINE__,"Not saving %s userdata - m_application_uuid is nil.",cid->ClassName());
      continue; 
    }

    // See if we have unknown user data (goo) and make sure
    // IsUnknownUserData() agrees with ON_UnknownUserData::Cast().
    const ON_UnknownUserData* unknown_ud = ON_UnknownUserData::Cast(ud);
    if ( 0 == unknown_ud )
    {
      if ( ud->IsUnknownUserData() )
      {
        ON_ERROR("ON_UnknownUserData::Cast(ud) is null and ud->IsUnknownUserData() is true.");
        continue; // something's wrong
      }
    }
    else
    {
      if ( !ud->IsUnknownUserData() )
      {
        ON_ERROR("ON_UnknownUserData::Cast(ud) is not null and ud->IsUnknownUserData() is false.");
        continue; // something's wrong
      }
    }

    if ( 0 != unknown_ud )
    {
      if (false == bSaveAllUserData && false == bSaveSelectedUserData)
        continue; // unknown user data cannot be critical

      if ( unknown_ud->m_3dm_version <= 3 )
        continue; // Unknown will not be resaved in V3 archives

      if ( unknown_ud->m_3dm_version > 5 && unknown_ud->m_3dm_version < 50 )
        continue;

      if ( unknown_ud->m_3dm_opennurbs_version_number < 200701010 )
        continue;

      if ( unknown_ud->m_3dm_version >= 50 && m_3dm_version < 50 )
      {
        // Unknown userdata with 8 byte chunk lengths cannot be
        // saved into a V4 file with 4 byte chunk lengths because
        // the resulting chunk will be unreadable in V4.
        // This is not an error condition.  It is a consequence
        // of V4 IO code not being robust enough to handle
        // 8 bytes chunk lengths.
        continue;
      }
    }

    // Each piece of user data is inside of 
    // a TCODE_OPENNURBS_CLASS_USERDATA chunk.
    rc = BeginWrite3dmChunk( TCODE_OPENNURBS_CLASS_USERDATA, 0 );
    if (rc) {
      rc = Write3dmChunkVersion(2,2);
      // wrap user data header info in an TCODE_OPENNURBS_CLASS_USERDATA_HEADER chunk
      rc = BeginWrite3dmChunk( TCODE_OPENNURBS_CLASS_USERDATA_HEADER, 0 );
      if (rc) 
      {
        if ( rc ) rc = WriteUuid( userdata_classid );
        if ( rc ) rc = WriteUuid( ud->m_userdata_uuid );
        if ( rc ) rc = WriteInt( ud->m_userdata_copycount );
        if ( rc ) rc = WriteXform( ud->m_userdata_xform );

        // added for version 2.1
        if ( rc ) rc = WriteUuid( ud->m_application_uuid );

        // added for version 2.2 - 14, October 2009
        if ( rc )
        {
          rc = WriteBool( unknown_ud ? true : false );
          // ver = 2,3,4,50,60,...
          const int file_format_ver = unknown_ud ? unknown_ud->m_3dm_version : m_3dm_version;
          rc = WriteInt(file_format_ver);
          // ver = opennurbs version number
          unsigned int app_ver = unknown_ud ? unknown_ud->m_3dm_opennurbs_version_number : m_3dm_opennurbs_version;
          unsigned int app_ver_to_write = ON_BinaryArchive::ArchiveOpenNURBSVersionToWrite(file_format_ver, app_ver);
          if (rc) rc = WriteInt(app_ver_to_write);
        }

        if ( !EndWrite3dmChunk() )
          rc = false;
      }
      if (rc) 
      {
        // wrap user data in an anonymous chunk
        rc = BeginWrite3dmChunk( TCODE_ANONYMOUS_CHUNK, 0 );
        if ( rc ) 
        {
          if ( 0 != unknown_ud )
          {
            // 22 January 2004 Dale Lear
            //   Disable crc checking when writing the
            //   unknow user data block.
            //   This has to be done so we don't get an extra
            //   32 bit CRC calculated on the block that
            //   ON_UnknownUserData::Write() writes.  The
            //   original 32 bit crc is at the end of this
            //   block and will be checked when the class
            //   that wrote this user data is present.
            //   The EndWrite3dmChunk() will reset the
            //   CRC checking flags to the appropriate
            //   values.
            m_chunk.Last()->m_do_crc16 = 0;
            m_chunk.Last()->m_do_crc32 = 0;
            m_bDoChunkCRC = false;
          }

          if (m_user_data_depth < 0)
          {
            ON_ERROR("m_user_data_depth < 0");
            m_user_data_depth = 0;
          }
          m_user_data_depth++;
          rc = ud->Write(*this)?true:false;
          m_user_data_depth--;
          if ( !EndWrite3dmChunk() )
            rc = false;
        }
      }
      if ( !EndWrite3dmChunk() )
        rc = false;
    }
  }


  if (0 != delete_this_ud)
  {
    if (0 == delete_this_ud->m_userdata_next)
    {
      if (const_cast<ON_Object&>(object).DetachUserData(delete_this_ud))
        delete delete_this_ud;
    }
    delete_this_ud = 0;
  }

  return rc;
}